

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

vec2 __thiscall djb::tab::cdfv(tab *this,vec2 *u,vec3 *wi)

{
  float_t u_00;
  float_t u_01;
  pointer pvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  vec2 vVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float_t w4;
  int l2;
  float_t w3;
  float_t w2;
  float_t w1;
  int i2;
  int i1;
  int l1;
  int k2;
  int k1;
  int j2;
  int j1;
  float local_60;
  int local_5c;
  float local_58;
  float local_54;
  float local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  fVar12 = wi->z;
  fVar11 = 0.0;
  if (fVar12 < 1.0) {
    fVar11 = atan2f(wi->y,wi->x);
    fVar12 = wi->z;
  }
  u_00 = u->x;
  u_01 = u->y;
  fVar12 = acosf(fVar12);
  pvVar1 = (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
           super__Vector_impl_data._M_start;
  spline::uwrap_edge(u_00,0x200,&local_48,&local_4c,&local_50);
  spline::uwrap_edge(u_01,0x40,&local_34,&local_38,&local_54);
  spline::uwrap_edge(fVar12 * 0.63661975 * fVar12 * 0.63661975,0x10,&local_3c,&local_40,&local_58);
  spline::uwrap_repeat((fVar11 / 3.1415927 + 1.0) * 0.5,0x20,&local_44,&local_5c,&local_60);
  iVar3 = local_44 * 0x400 + local_3c * 0x40;
  iVar4 = local_44 * 0x400 + local_40 * 0x40;
  iVar2 = local_3c * 0x40 + local_5c * 0x400;
  iVar5 = local_5c * 0x400 + local_40 * 0x40;
  iVar9 = (iVar3 + local_34) * 0x200;
  iVar6 = (iVar3 + local_38) * 0x200;
  iVar10 = (iVar4 + local_34) * 0x200;
  iVar4 = (iVar4 + local_38) * 0x200;
  iVar8 = (iVar2 + local_34) * 0x200;
  iVar3 = (iVar2 + local_38) * 0x200;
  iVar7 = (local_34 + iVar5) * 0x200;
  iVar2 = (iVar5 + local_38) * 0x200;
  fVar14 = pvVar1[iVar9 + local_48].x;
  fVar15 = pvVar1[iVar9 + local_48].y;
  fVar14 = (pvVar1[iVar9 + local_4c].x - fVar14) * local_50 + fVar14;
  fVar15 = (pvVar1[iVar9 + local_4c].y - fVar15) * local_50 + fVar15;
  fVar26 = pvVar1[iVar6 + local_48].x;
  fVar27 = pvVar1[iVar6 + local_48].y;
  fVar16 = pvVar1[iVar10 + local_48].x;
  fVar17 = pvVar1[iVar10 + local_48].y;
  fVar16 = (pvVar1[iVar10 + local_4c].x - fVar16) * local_50 + fVar16;
  fVar17 = (pvVar1[iVar10 + local_4c].y - fVar17) * local_50 + fVar17;
  fVar12 = pvVar1[iVar4 + local_48].x;
  fVar11 = pvVar1[iVar4 + local_48].y;
  fVar18 = pvVar1[iVar8 + local_48].x;
  fVar19 = pvVar1[iVar8 + local_48].y;
  fVar18 = (pvVar1[iVar8 + local_4c].x - fVar18) * local_50 + fVar18;
  fVar19 = (pvVar1[iVar8 + local_4c].y - fVar19) * local_50 + fVar19;
  fVar22 = pvVar1[iVar3 + local_48].x;
  fVar23 = pvVar1[iVar3 + local_48].y;
  fVar20 = pvVar1[iVar7 + local_48].x;
  fVar21 = pvVar1[iVar7 + local_48].y;
  fVar20 = (pvVar1[iVar7 + local_4c].x - fVar20) * local_50 + fVar20;
  fVar21 = (pvVar1[iVar7 + local_4c].y - fVar21) * local_50 + fVar21;
  fVar24 = pvVar1[local_48 + iVar2].x;
  fVar25 = pvVar1[local_48 + iVar2].y;
  fVar14 = (((pvVar1[iVar6 + local_4c].x - fVar26) * local_50 + fVar26) - fVar14) * local_54 +
           fVar14;
  fVar15 = (((pvVar1[iVar6 + local_4c].y - fVar27) * local_50 + fVar27) - fVar15) * local_54 +
           fVar15;
  fVar18 = (((pvVar1[iVar3 + local_4c].x - fVar22) * local_50 + fVar22) - fVar18) * local_54 +
           fVar18;
  fVar19 = (((pvVar1[iVar3 + local_4c].y - fVar23) * local_50 + fVar23) - fVar19) * local_54 +
           fVar19;
  fVar14 = (((((pvVar1[iVar4 + local_4c].x - fVar12) * local_50 + fVar12) - fVar16) * local_54 +
            fVar16) - fVar14) * local_58 + fVar14;
  fVar15 = (((((pvVar1[iVar4 + local_4c].y - fVar11) * local_50 + fVar11) - fVar17) * local_54 +
            fVar17) - fVar15) * local_58 + fVar15;
  vVar13.x = local_60 *
             (((((((pvVar1[iVar2 + local_4c].x - fVar24) * local_50 + fVar24) - fVar20) * local_54 +
                fVar20) - fVar18) * local_58 + fVar18) - fVar14) + fVar14;
  vVar13.y = local_60 *
             (((((((pvVar1[iVar2 + local_4c].y - fVar25) * local_50 + fVar25) - fVar21) * local_54 +
                fVar21) - fVar19) * local_58 + fVar19) - fVar15) + fVar15;
  return vVar13;
}

Assistant:

vec2 tab::cdfv(const vec2 &u, const vec3 &wi) const
{
	int res1 = 512;
	int res2 = 64;
	int res3 = 16;
	int res4 = 32;
	float_t pi = wi.z < 1 ? atan2(wi.y, wi.x) : 0;
	float_t u1 = u.x;
	float_t u2 = u.y;
	float_t u3 = sqr(acos(wi.z) * (2 / m_pi()));
	float_t u4 = (pi / m_pi() + 1) / 2;

	return spline::eval4d(m_cdf,
	                      res1, res2, res3, res4,
	                      spline::uwrap_edge  , u1,
	                      spline::uwrap_edge  , u2,
	                      spline::uwrap_edge  , u3,
	                      spline::uwrap_repeat, u4);
}